

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

tb_page_addr_t
get_page_addr_code_hostp_m68k(CPUArchState_conflict3 *env,target_ulong_conflict addr,void **hostp)

{
  ulong uVar1;
  _Bool _Var2;
  tb_page_addr_t tVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  void *ptr;
  CPUM68KState_conflict *__mptr;
  uint page;
  bool bVar7;
  
  bVar7 = (env->sr & 0x2000) == 0;
  uVar1 = (ulong)bVar7;
  uVar5 = env->dregs[uVar1 * 4 + -0xc] >> 6 & addr >> 0xc;
  uVar4 = (ulong)(uVar5 << 6);
  lVar6 = *(long *)(env->dregs + uVar1 * 4 + -10) + uVar4;
  page = addr & 0xfffff000;
  if ((*(uint *)(*(long *)(env->dregs + uVar1 * 4 + -10) + 8 + uVar4) & 0xfffff800) != page) {
    _Var2 = victim_tlb_hit(env,(ulong)bVar7,(ulong)uVar5,8,page);
    if (!_Var2) {
      tlb_fill((CPUState *)(env[-0x40].fregs + 2),addr,0,MMU_INST_FETCH,(uint)bVar7,0);
      uVar4 = (ulong)((addr >> 0xc & env->dregs[uVar1 * 4 + -0xc] >> 6) << 6);
      if ((*(byte *)(*(long *)(env->dregs + uVar1 * 4 + -10) + 9 + uVar4) & 8) != 0) {
        return 0xffffffffffffffff;
      }
      lVar6 = *(long *)(env->dregs + uVar1 * 4 + -10) + uVar4;
    }
    if ((*(uint *)(lVar6 + 8) & 0xfffff800) != page) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_m68k(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((*(byte *)(lVar6 + 9) & 2) == 0) {
    ptr = (void *)((ulong)addr + *(long *)(lVar6 + 0x10));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    tVar3 = qemu_ram_addr_from_host_m68k(env->uc,ptr);
    if (tVar3 == 0xffffffffffffffff) {
      abort();
    }
  }
  else {
    tVar3 = 0xffffffffffffffff;
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  return tVar3;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}